

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O3

void matchmassage(int nderiv)

{
  Symbol *pSVar1;
  char *pcVar2;
  List *l;
  Item *pIVar3;
  Item *pIVar4;
  int iVar5;
  List *pLVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Item *pIVar10;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar11;
  
  matchused = 0;
  pLVar6 = match_init->next;
  if (pLVar6 == match_init) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      pSVar1 = (pLVar6->element).sym;
      pIVar4 = deriv_state_list;
      do {
        pIVar4 = pIVar4->next;
        if (pIVar4 == deriv_state_list) goto LAB_0011500c;
      } while ((Symbol *)(pIVar4->element).itm != pSVar1);
      delete(pIVar4);
LAB_0011500c:
      if (((ulong)((anon_union_8_4_46e41722_for_element *)&pSVar1->subtype)->itm & 0x10) == 0) {
        diag(pSVar1->name," is not a state");
      }
      iVar5 = 1;
      if (((ulong)((anon_union_8_4_46e41722_for_element *)&pSVar1->subtype)->itm & 0x20) != 0) {
        iVar5 = pSVar1->araydim;
      }
      uVar7 = uVar7 + iVar5;
      pLVar6 = pLVar6->next;
    } while (pLVar6 != match_init);
  }
  uVar8 = nderiv - uVar7;
  if (uVar8 == 0 || nderiv < (int)uVar7) {
    diag("Nothing to match",(char *)0x0);
  }
  lappendstr(procfunc,
             "\n_init_match(_save) double _save;{ int _i;\nif (_match_recurse) {_match_recurse = 0;\n"
            );
  sprintf(buf,"for (_i=0; _i<%d; _i++) _found_init[_i] = _p[_state_get[_i]];\n",(ulong)uVar8);
  pIVar4 = lappendstr(procfunc,buf);
  pcVar2 = indepsym->name;
  sprintf(buf,
          "error=shoot(%d, &(%s) - _p, _pmatch_time, _pmatch_value, _state_match, _found_init, _p, &(d%s));\n if(error){abort_run(error);}; %s = _save;"
          ,(ulong)uVar8,pcVar2,pcVar2,pcVar2);
  lappendstr(procfunc,buf);
  lappendstr(procfunc,"\n initmodel(_p); _match_recurse = 1;\n}\n");
  sprintf(buf,"for (_i=0; _i<%d; _i++) _p[_state_get[_i]] = _found_init[_i];",(ulong)uVar8);
  lappendstr(procfunc,buf);
  lappendstr(procfunc,"\n}\n\n");
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  pLVar6 = deriv_state_list->next;
  if (pLVar6 != deriv_state_list) {
    uVar9 = 0;
    do {
      pSVar1 = (pLVar6->element).sym;
      if ((pSVar1->subtype & 0x20) == 0) {
        sprintf(buf,"_state_get[%d] = &(%s) - _p;\n",uVar9,pSVar1->name);
        iVar5 = 1;
      }
      else {
        sprintf(buf,"for (_i=0; _i<%d; _i++) {_state_get[%d+_i] = (%s + _i) - _p;}\n",
                (ulong)(uint)pSVar1->araydim,uVar9,pSVar1->name);
        iVar5 = pSVar1->araydim;
      }
      uVar9 = (ulong)(uint)((int)uVar9 + iVar5);
      lappendstr(initlist,buf);
      uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      pLVar6 = pLVar6->next;
    } while (pLVar6 != deriv_state_list);
  }
  sprintf(buf,
          "static int _state_get[%d], _state_match[%d];\nstatic double _match_time[%d], _match_value[%d], _found_init[%d];\n"
          ,(ulong)uVar8,(ulong)uVar8,(ulong)uVar8,(ulong)uVar8,CONCAT44(uVar11,uVar8));
  linsertstr(procfunc,buf);
  sprintf(buf,"static double *_pmatch_time[%d], *_pmatch_value[%d];\n",(ulong)uVar8,(ulong)uVar8);
  linsertstr(procfunc,buf);
  pLVar6 = match_bound->next;
  if (pLVar6 != match_bound) {
    uVar9 = 0;
    do {
      pSVar1 = (pLVar6->element).sym;
      if ((pSVar1->subtype & 0x10U) == 0) {
        diag(pSVar1->name," is not a state");
      }
      l = (pLVar6->next->element).lst;
      pIVar10 = pLVar6->next->next;
      pLVar6 = (pIVar10->element).lst;
      if ((pSVar1->subtype & 0x20U) == 0) {
        sprintf(buf,"_state_match[%d] = &(%s) - _p;\n",uVar9,pSVar1->name);
        lappendstr(initlist,buf);
        sprintf(buf,"_match_time[%d] = ",uVar9);
        insertstr(pIVar4,buf);
        copylist(l,pIVar4);
        sprintf(buf,";\n _match_value[%d] = ",uVar9);
        insertstr(pIVar4,buf);
        copylist(pLVar6,pIVar4);
        insertstr(pIVar4,";\n");
        iVar5 = 1;
      }
      else {
        pIVar10 = pIVar10->next;
        pIVar3 = (pIVar10->element).itm;
        sprintf(buf,"for (_i=0; _i<%d; _i++) {_state_match[%d+_i] = (%s + _i) - _p;}\n",
                (ulong)(uint)pSVar1->araydim,uVar9,pSVar1->name);
        lappendstr(initlist,buf);
        sprintf(buf,"{int %s; for (%s=0; %s<%d; %s++) {\n",pIVar3,pIVar3,pIVar3,
                (ulong)(uint)pSVar1->araydim,pIVar3);
        insertstr(pIVar4,buf);
        sprintf(buf,"_match_time[%s + %d] = ",pIVar3,uVar9);
        insertstr(pIVar4,buf);
        copylist(l,pIVar4);
        sprintf(buf,";\n _match_value[%s + %d] = ",pIVar3,uVar9);
        insertstr(pIVar4,buf);
        copylist(pLVar6,pIVar4);
        insertstr(pIVar4,";\n}}\n");
        iVar5 = pSVar1->araydim;
      }
      uVar7 = uVar7 + iVar5;
      uVar9 = (ulong)(uint)((int)uVar9 + iVar5);
      pLVar6 = pIVar10->next;
    } while (pLVar6 != match_bound);
  }
  sprintf(buf,"for(_i=0; _i<%d; _i++) { _pmatch_time[_i] = _match_time + _i;\n",(ulong)uVar8);
  lappendstr(initlist,buf);
  lappendstr(initlist,"_pmatch_value[_i] = _match_value + _i;\n }\n");
  if (uVar7 != nderiv) {
    sprintf(buf,"%d equations != %d MATCH specs",(ulong)(uint)nderiv,(ulong)uVar7);
    diag(buf,(char *)0x0);
  }
  return;
}

Assistant:

void matchmassage(nderiv)
	int nderiv;
{
	int count, nunknown, j;
	Item *q, *q1, *setup;
	Symbol *s;
	List *tmatch, *vmatch;
	char *imatch;

	matchused = 0;
	/* we have a list of states at which the initial values are known
	and a list of information about state(time) = match with implicit loop
	index if array.
	
	check that the total number of conditions = nderiv.
	the number of unknown initial conditions is the complement of the
	states which have known initial conditions ( the number of states
	in the match_bound list. Note that the complement of match_init
	states is NOT the list of states in match_bound.
	
	We create
	  1) array of doubles which will receive the values of
	  the found initial conditions. (_found_init)
	  2) array of doubles which receives the match times
	  3) array of doubles which receives the match values
	  4) array of state pointers(state_match). we solve
	     *statematch(matchtime) = matchvalue
	  5) array of state pointers(state_get). We initialize with
	     *state_get = _found_init
	  6) since 2, 3, 4 must be sorted according to match times we
	     create pointer arrays to 2 and 3 and pass those.
	  7) Spec of shoot requires the passing of pointer array to
	     found_init.


	At this time I don't know how this can be restarted.
	
	Initmodel() calls _initmatch() which
	1) if first=1 then sets first=0
	sets up match times, match values, initializes
	_found_init, calls shoot(), calls initmodel(),
	sets first = 1 and exits.
	2) if first=0 then put _found_init into states and exit.
	
	Call to _initmatch must be the last thing done in initmodel() in
	case the user desires to give good starting initial values to
	help shoot().
	*/

	count = 0;
	
	ITERATE(q, match_init) { /* these initializations are done
		automatically by initmodel(), so just remove the state
		from the deriv_state_list */
		s = SYM(q);
		ITERATE(q1, deriv_state_list) {
			if (SYM(q1) == s) {
				delete(q1);
				break;
			}
		}
		if (!(s->subtype & STAT)) {
			diag(s->name, " is not a state");
		}
		if (s->subtype & ARRAY) {
			count += s->araydim;
		}else{
			count++;
		}
	}
	nunknown = nderiv - count;
	if (nunknown <= 0) {
		diag("Nothing to match", (char *)0);
	}
	/* the ones that are still marked are the ones to solve for */
	
	/* add the boilerplate for _initmatch and save the location
	where model specific info goes.
	*/
Lappendstr(procfunc, "\n_init_match(_save) double _save;{ int _i;\nif (_match_recurse) {_match_recurse = 0;\n");
Sprintf(buf, "for (_i=0; _i<%d; _i++) _found_init[_i] = _p[_state_get[_i]];\n",
		nunknown);
	setup = lappendstr(procfunc, buf);
Sprintf(buf, "error=shoot(%d, &(%s) - _p, _pmatch_time, _pmatch_value, _state_match,\
 _found_init, _p, &(d%s));\n if(error){abort_run(error);}; %s = _save;",
		nunknown, indepsym->name, indepsym->name, indepsym->name);
		/*deltaindep may not be declared yet */
	Lappendstr(procfunc, buf);
	Lappendstr(procfunc,"\n initmodel(_p); _match_recurse = 1;\n}\n");
	Sprintf(buf, "for (_i=0; _i<%d; _i++) _p[_state_get[_i]] = _found_init[_i];",
		nunknown);
	Lappendstr(procfunc, buf);
	Lappendstr(procfunc, "\n}\n\n");

	/* construct _state_get from the marked states */
	j = 0;

	ITERATE(q, deriv_state_list) {
		s = SYM(q);
		if (s->subtype & ARRAY) {
Sprintf(buf, "for (_i=0; _i<%d; _i++) {_state_get[%d+_i] = (%s + _i) - _p;}\n",
	s->araydim, j, s->name);
			j += s->araydim;
		} else {
			Sprintf(buf, "_state_get[%d] = &(%s) - _p;\n", j, s->name);
			j++;
		}
		Lappendstr(initlist, buf);
	}
	/* declare the arrays */
	Sprintf(buf, "static int _state_get[%d], _state_match[%d];\n\
static double _match_time[%d], _match_value[%d], _found_init[%d];\n",
		nunknown, nunknown, nunknown, nunknown, nunknown);
	Linsertstr(procfunc, buf);
	Sprintf(buf, "static double *_pmatch_time[%d], *_pmatch_value[%d];\n",
 		nunknown, nunknown);
	Linsertstr(procfunc, buf);
	
	/* create the _state_match stuff */
	j = 0;
	ITERATE(q, match_bound) {
		s = SYM(q);
		if (!(s->subtype & STAT)) {
			diag(s->name, " is not a state");
		}
		tmatch = LST(q = q->next);
		vmatch = LST(q = q->next);
		if (s->subtype & ARRAY) {
			imatch = STR(q = q->next);
Sprintf(buf, "for (_i=0; _i<%d; _i++) {_state_match[%d+_i] = (%s + _i) - _p;}\n",
			s->araydim, j, s->name);
			Lappendstr(initlist, buf);
Sprintf(buf, "{int %s; for (%s=0; %s<%d; %s++) {\n",
imatch, imatch, imatch, s->araydim, imatch);
			Insertstr(setup, buf);
Sprintf(buf, "_match_time[%s + %d] = ", imatch, j);
			Insertstr(setup, buf);
			copylist(tmatch, setup);
Sprintf(buf, ";\n _match_value[%s + %d] = ", imatch, j);
			Insertstr(setup, buf);
			copylist(vmatch, setup);
			Insertstr(setup, ";\n}}\n");
			j += s->araydim;
			count += s->araydim;
		}else{
Sprintf(buf, "_state_match[%d] = &(%s) - _p;\n", j, s->name);
			Lappendstr(initlist, buf);
Sprintf(buf, "_match_time[%d] = ", j);
			Insertstr(setup, buf);
			copylist(tmatch, setup);
Sprintf(buf, ";\n _match_value[%d] = ", j);
			Insertstr(setup, buf);
			copylist(vmatch, setup);
			Insertstr(setup, ";\n");
			j++;
			count++;
		}
	}
	/* set up the trivial pointer arrays */
	Sprintf(buf, "for(_i=0; _i<%d; _i++) { _pmatch_time[_i] = _match_time + _i;\n",
		nunknown);
	Lappendstr(initlist, buf);
	Lappendstr(initlist, "_pmatch_value[_i] = _match_value + _i;\n }\n");
	if (count != nderiv) {
		Sprintf(buf, "%d equations != %d MATCH specs", nderiv, count);
		diag(buf, (char *)0);
	}
			
}